

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d4c.cpp
# Opt level: O0

void anon_unknown.dwarf_4211::GetCentroid
               (double *x,int x_length,int fs,double current_f0,int fft_size,double current_position
               ,ForwardRealFFT *forward_real_fft,double *centroid,RandnState *randn_state)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  fft_plan p;
  fft_plan p_00;
  int iVar4;
  int iVar5;
  ulong uVar6;
  double *in_stack_fffffffffffffed0;
  int local_104;
  undefined1 auStack_100 [4];
  int i_5;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  int local_b8;
  int local_b4;
  int i_4;
  int i_3;
  double *tmp_imag;
  double *tmp_real;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  int local_58;
  int local_54;
  int i_2;
  int i_1;
  double power;
  double *pdStack_40;
  int i;
  double *centroid_local;
  ForwardRealFFT *forward_real_fft_local;
  double current_position_local;
  double dStack_20;
  int fft_size_local;
  double current_f0_local;
  int fs_local;
  int x_length_local;
  double *x_local;
  
  for (power._4_4_ = 0; power._4_4_ < fft_size; power._4_4_ = power._4_4_ + 1) {
    forward_real_fft->waveform[power._4_4_] = 0.0;
  }
  pdStack_40 = centroid;
  centroid_local = (double *)forward_real_fft;
  forward_real_fft_local = (ForwardRealFFT *)current_position;
  current_position_local._4_4_ = fft_size;
  dStack_20 = current_f0;
  current_f0_local._0_4_ = fs;
  current_f0_local._4_4_ = x_length;
  _fs_local = x;
  GetWindowedWaveform(x,x_length,fs,current_f0,current_position,2,4.0,forward_real_fft->waveform,
                      randn_state);
  _i_2 = 0.0;
  local_54 = 0;
  while( true ) {
    iVar4 = local_54;
    iVar5 = matlab_round(((double)current_f0_local._0_4_ * 2.0) / dStack_20);
    if (iVar4 != iVar5 * 2 && SBORROW4(iVar4,iVar5 * 2) == iVar4 + iVar5 * -2 < 0) break;
    _i_2 = *(double *)((long)centroid_local[1] + (long)local_54 * 8) *
           *(double *)((long)centroid_local[1] + (long)local_54 * 8) + _i_2;
    local_54 = local_54 + 1;
  }
  local_58 = 0;
  while( true ) {
    iVar4 = local_58;
    iVar5 = matlab_round(((double)current_f0_local._0_4_ * 2.0) / dStack_20);
    if (iVar4 != iVar5 * 2 && SBORROW4(iVar4,iVar5 * 2) == iVar4 + iVar5 * -2 < 0) break;
    dVar3 = sqrt(_i_2);
    *(double *)((long)centroid_local[1] + (long)local_58 * 8) =
         *(double *)((long)centroid_local[1] + (long)local_58 * 8) / dVar3;
    local_58 = local_58 + 1;
  }
  memcpy(&tmp_real,centroid_local + 3,0x48);
  p._8_8_ = local_90;
  p.n = (undefined4)uStack_98;
  p.sign = uStack_98._4_4_;
  p.c_in = (fft_complex *)uStack_88;
  p.in = (double *)local_80;
  p.c_out = (fft_complex *)uStack_78;
  p.out = (double *)local_70;
  p.input = (double *)uStack_68;
  p.ip = (int *)local_60;
  p.w = in_stack_fffffffffffffed0;
  fft_execute(p);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(current_position_local._4_4_ / 2 + 1);
  uVar6 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  tmp_imag = (double *)operator_new__(uVar6);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(current_position_local._4_4_ / 2 + 1);
  uVar6 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar6 = 0xffffffffffffffff;
  }
  _i_4 = operator_new__(uVar6);
  for (local_b4 = 0; local_b4 <= current_position_local._4_4_ / 2; local_b4 = local_b4 + 1) {
    tmp_imag[local_b4] = *(double *)((long)centroid_local[2] + (long)local_b4 * 0x10);
    *(undefined8 *)((long)_i_4 + (long)local_b4 * 8) =
         *(undefined8 *)((long)centroid_local[2] + (long)local_b4 * 0x10 + 8);
  }
  for (local_b8 = 0; local_b8 < current_position_local._4_4_; local_b8 = local_b8 + 1) {
    *(double *)((long)centroid_local[1] + (long)local_b8 * 8) =
         ((double)local_b8 + 1.0) * *(double *)((long)centroid_local[1] + (long)local_b8 * 8);
  }
  memcpy(auStack_100,centroid_local + 3,0x48);
  p_00._8_8_ = local_f0;
  p_00.n = (undefined4)uStack_f8;
  p_00.sign = uStack_f8._4_4_;
  p_00.c_in = (fft_complex *)uStack_e8;
  p_00.in = (double *)local_e0;
  p_00.c_out = (fft_complex *)uStack_d8;
  p_00.out = (double *)local_d0;
  p_00.input = (double *)uStack_c8;
  p_00.ip = (int *)local_c0;
  p_00.w = in_stack_fffffffffffffed0;
  fft_execute(p_00);
  for (local_104 = 0; local_104 <= current_position_local._4_4_ / 2; local_104 = local_104 + 1) {
    pdStack_40[local_104] =
         *(double *)((long)centroid_local[2] + (long)local_104 * 0x10) * tmp_imag[local_104] +
         *(double *)((long)_i_4 + (long)local_104 * 8) *
         *(double *)((long)centroid_local[2] + (long)local_104 * 0x10 + 8);
  }
  if (tmp_imag != (double *)0x0) {
    operator_delete__(tmp_imag);
  }
  if (_i_4 != (void *)0x0) {
    operator_delete__(_i_4);
  }
  return;
}

Assistant:

static void GetCentroid(const double *x, int x_length, int fs,
    double current_f0, int fft_size, double current_position,
    const ForwardRealFFT *forward_real_fft, double *centroid,
    RandnState *randn_state) {
  for (int i = 0; i < fft_size; ++i) forward_real_fft->waveform[i] = 0.0;
  GetWindowedWaveform(x, x_length, fs, current_f0,
      current_position, world::kBlackman, 4.0, forward_real_fft->waveform, randn_state);
  double power = 0.0;
  for (int i = 0; i <= matlab_round(2.0 * fs / current_f0) * 2; ++i)
    power += forward_real_fft->waveform[i] * forward_real_fft->waveform[i];
  for (int i = 0; i <= matlab_round(2.0 * fs / current_f0) * 2; ++i)
    forward_real_fft->waveform[i] /= sqrt(power);

  fft_execute(forward_real_fft->forward_fft);
  double *tmp_real = new double[fft_size / 2 + 1];
  double *tmp_imag = new double[fft_size / 2 + 1];
  for (int i = 0; i <= fft_size / 2; ++i) {
    tmp_real[i] = forward_real_fft->spectrum[i][0];
    tmp_imag[i] = forward_real_fft->spectrum[i][1];
  }

  for (int i = 0; i < fft_size; ++i)
    forward_real_fft->waveform[i] *= i + 1.0;
  fft_execute(forward_real_fft->forward_fft);
  for (int i = 0; i <= fft_size / 2; ++i)
    centroid[i] = forward_real_fft->spectrum[i][0] * tmp_real[i] +
      tmp_imag[i] * forward_real_fft->spectrum[i][1];

  delete[] tmp_real;
  delete[] tmp_imag;
}